

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastMtS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  undefined8 *puVar1;
  ParseContext *pPVar2;
  ZeroCopyInputStream *pZVar3;
  long lVar4;
  ParseContext *pPVar5;
  byte bVar6;
  bool bVar7;
  unsigned_short uVar8;
  uint16_t uVar9;
  uint uVar10;
  uint32_t uVar11;
  int v1;
  int v2;
  char *pcVar12;
  uint *puVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  FieldAux *pFVar15;
  MessageLite *pMVar16;
  TcParseTableBase *pTVar17;
  ulong uVar18;
  TailCallParseFunc p_Var19;
  LogMessage *pLVar20;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_class_24_3_cc722eaf inner_loop;
  TcParseTableBase *inner_table;
  FieldAux aux;
  MessageLite **field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1c0;
  unsigned_short saved_tag;
  uint64_t local_1b8;
  TcParseTableBase *local_1b0;
  ParseContext *local_1a8;
  ZeroCopyInputStream *local_1a0;
  MessageLite *local_198;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_190 [2];
  uint local_17c;
  TcParseTableBase *pTStack_178;
  uint32_t has_bits_offset;
  ulong local_170;
  MessageLite *local_168;
  Arena *local_160;
  TcParseTableBase *local_158;
  LimitToken local_14c;
  undefined1 local_148 [16];
  LogMessageFatal local_138 [23];
  Voidify local_121;
  string *local_120;
  string *absl_log_internal_check_op_result;
  undefined4 local_110;
  int old_depth;
  LimitToken local_fc;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *paStack_f8;
  LimitToken old;
  ZeroCopyInputStream *local_e0;
  undefined1 local_c8 [12];
  int size;
  ZeroCopyInputStream *local_b8;
  ParseContext *local_b0;
  ZeroCopyInputStream *local_a8;
  ZeroCopyInputStream *local_a0;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 *local_98;
  TcFieldData local_90;
  long local_88;
  ParseContext *local_80;
  ZeroCopyInputStream *local_78;
  MessageLite *local_70;
  ZeroCopyInputStream *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_1b8 = hasbits;
  local_1b0 = table;
  local_1a8 = ctx;
  local_1a0 = (ZeroCopyInputStream *)ptr;
  local_198 = msg;
  local_190[0] = data.field_0;
  uVar8 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)local_190);
  pMVar16 = local_198;
  pZVar3 = local_1a0;
  pPVar2 = local_1a8;
  if (uVar8 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe40);
    pcVar12 = MiniParse(pMVar16,(char *)pZVar3,pPVar2,(TcFieldData)aStack_1c0,local_1b0,local_1b8);
    return pcVar12;
  }
  UnalignedLoad<unsigned_short>((char *)local_1a0);
  local_1a0 = (ZeroCopyInputStream *)((long)local_1a0 + 2);
  bVar6 = TcFieldData::hasbit_idx((TcFieldData *)local_190);
  local_1b8 = 1L << (bVar6 & 0x3f) | local_1b8;
  local_168 = local_198;
  pTStack_178 = local_1b0;
  local_17c = (uint)local_1b0->has_bits_offset;
  local_170 = local_1b8;
  if (local_17c != 0) {
    uVar10 = (uint)local_1b8;
    puVar13 = RefAt<unsigned_int>(local_198,(ulong)local_17c);
    *puVar13 = uVar10 | *puVar13;
  }
  pMVar16 = local_198;
  uVar9 = TcFieldData::offset((TcFieldData *)local_190);
  aVar14 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           RefAt<google::protobuf::MessageLite*>(pMVar16,(ulong)uVar9);
  pTVar17 = local_1b0;
  bVar6 = TcFieldData::aux_idx((TcFieldData *)local_190);
  pFVar15 = TcParseTableBase::field_aux(pTVar17,(uint)bVar6);
  pTVar17 = pFVar15->table;
  inner_loop.inner_table = (TcParseTableBase **)pTVar17;
  if (*(MessageLite **)aVar14 == (MessageLite *)0x0) {
    local_160 = MessageLite::GetArena(local_198);
    local_158 = pTVar17;
    pMVar16 = ClassData::New(pTVar17->class_data,local_160);
    *(MessageLite **)aVar14 = pMVar16;
  }
  pZVar3 = local_1a0;
  pPVar2 = local_1a8;
  inner_loop.field = (MessageLite **)&local_1a8;
  inner_loop.ctx = (ParseContext **)&inner_loop.inner_table;
  paStack_f8 = &data_local.field_0;
  data_local.field_0 = aVar14;
  EpsCopyInputStream::LimitToken::LimitToken(&local_fc);
  local_b0 = pPVar2;
  local_b8 = pZVar3;
  unique0x100004f4 = &local_fc;
  local_c8._4_4_ = ReadSize((char **)&local_b8);
  if ((local_b8 == (ZeroCopyInputStream *)0x0) || (pPVar2->depth_ < 1)) {
    local_a8 = (ZeroCopyInputStream *)0x0;
  }
  else {
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_c8,(char *)pPVar2,(int)local_b8);
    EpsCopyInputStream::LimitToken::operator=(stack0xffffffffffffff40,(LimitToken *)local_c8);
    EpsCopyInputStream::LimitToken::~LimitToken((LimitToken *)local_c8);
    pPVar2->depth_ = pPVar2->depth_ + -1;
    local_a8 = local_b8;
  }
  if (local_a8 == (ZeroCopyInputStream *)0x0) {
    local_e0 = local_a8;
  }
  else {
    absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
    local_98 = paStack_f8;
    local_a0 = local_a8;
    local_70 = *(MessageLite **)*paStack_f8;
    local_80 = *(ParseContext **)paStack_f8[1];
    local_78 = local_a8;
    local_88 = *(long *)paStack_f8[2] + 0x38;
    while (bVar7 = ParseContext::Done(local_80,(char **)&local_78), pMVar16 = local_70,
          pZVar3 = local_78, pPVar5 = local_80, ((bVar7 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_90);
      lVar4 = local_88;
      pTVar17 = (TcParseTableBase *)(local_88 + -0x38);
      uVar8 = UnalignedLoad<unsigned_short>((char *)pZVar3);
      uVar18 = (ulong)(int)((uint)uVar8 & (uint)*(byte *)(lVar4 + -0x30));
      if ((uVar18 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x44d);
      }
      data_1.field_0 =
           (anon_union_8_1_898a9ca8_for_TcFieldData_0)
           TcParseTableBase::fast_entry(pTVar17,uVar18 >> 3);
      local_58.data =
           ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
           (ulong)uVar8;
      p_Var19 = TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
      local_60.data = local_58.data;
      local_78 = (ZeroCopyInputStream *)
                 (*p_Var19)(pMVar16,(char *)pZVar3,pPVar5,(TcFieldData)local_58,pTVar17,0);
      if ((local_78 == (ZeroCopyInputStream *)0x0) ||
         (uVar11 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar11 != 1))
      break;
    }
    if ((*(byte *)(local_88 + -0x2f) & 1) == 0) {
      local_68 = local_78;
      local_88 = local_88 + -0x38;
    }
    else {
      puVar1 = (undefined8 *)(local_88 + -0x10);
      local_88 = local_88 + -0x38;
      local_68 = (ZeroCopyInputStream *)(*(code *)*puVar1)(local_70,local_78,local_80);
    }
    local_e0 = local_68;
    if (local_68 != (ZeroCopyInputStream *)0x0) {
      v1 = absl::lts_20240722::log_internal::GetReferenceableValue
                     (absl_log_internal_check_op_result._4_4_);
      v2 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->depth_);
      local_120 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                            (v1,v2,"old_depth == depth_");
      if (local_120 != (string *)0x0) {
        local_148 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_120);
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,1099,local_148._0_8_,local_148._8_8_);
        pLVar20 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                            ((LogMessage *)local_138);
        absl::lts_20240722::log_internal::Voidify::operator&&(&local_121,pLVar20);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_138);
      }
      local_120 = (string *)0x0;
    }
    pPVar2->depth_ = pPVar2->depth_ + 1;
    EpsCopyInputStream::LimitToken::LimitToken(&local_14c,&local_fc);
    bVar7 = EpsCopyInputStream::PopLimit(&pPVar2->super_EpsCopyInputStream,&local_14c);
    EpsCopyInputStream::LimitToken::~LimitToken(&local_14c);
    if (((bVar7 ^ 0xffU) & 1) == 0) {
    }
    else {
      local_e0 = (ZeroCopyInputStream *)0x0;
    }
  }
  local_110 = 1;
  EpsCopyInputStream::LimitToken::~LimitToken(&local_fc);
  return (char *)local_e0;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMtS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, false, true>(
      PROTOBUF_TC_PARAM_PASS);
}